

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap13_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  undefined4 uVar1;
  ulong uVar2;
  FT_UInt local_24;
  FT_UInt gindex;
  TT_CMap13 cmap13;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  if ((*(char *)&cmap[1].cmap.charmap.face == '\0') ||
     (uVar2._0_4_ = cmap[1].cmap.charmap.encoding, uVar2._4_2_ = cmap[1].cmap.charmap.platform_id,
     uVar2._6_2_ = cmap[1].cmap.charmap.encoding_id, uVar2 != *pchar_code)) {
    local_24 = tt_cmap13_char_map_binary(cmap,pchar_code,'\x01');
  }
  else {
    tt_cmap13_next((TT_CMap13)cmap);
    if (*(char *)&cmap[1].cmap.charmap.face == '\0') {
      local_24 = 0;
    }
    else {
      local_24 = *(FT_UInt *)&cmap[1].cmap.clazz;
      uVar1 = cmap[1].cmap.charmap.encoding;
      *pchar_code = uVar1;
    }
  }
  return local_24;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap13_char_next( TT_CMap     cmap,
                       FT_UInt32  *pchar_code )
  {
    TT_CMap13  cmap13 = (TT_CMap13)cmap;
    FT_UInt    gindex;


    /* no need to search */
    if ( cmap13->valid && cmap13->cur_charcode == *pchar_code )
    {
      tt_cmap13_next( cmap13 );
      if ( cmap13->valid )
      {
        gindex      = cmap13->cur_gindex;
        *pchar_code = cmap13->cur_charcode;
      }
      else
        gindex = 0;
    }
    else
      gindex = tt_cmap13_char_map_binary( cmap, pchar_code, 1 );

    return gindex;
  }